

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

void __thiscall FStateDefinitions::MakeStateDefines(FStateDefinitions *this,PClassActor *cls)

{
  PClassActor *cls_local;
  FStateDefinitions *this_local;
  
  TArray<FState,_FState>::Clear(&this->StateArray);
  this->laststate = (FState *)0x0;
  this->laststatebeforelabel = (FState *)0x0;
  this->lastlabel = -1;
  if ((cls == (PClassActor *)0x0) || (cls->StateList == (FStateLabels *)0x0)) {
    TArray<FStateDefine,_FStateDefine>::Clear(&this->StateLabels);
  }
  else {
    MakeStateList(cls->StateList,&this->StateLabels);
  }
  return;
}

Assistant:

void FStateDefinitions::MakeStateDefines(const PClassActor *cls)
{
	StateArray.Clear();
	laststate = NULL;
	laststatebeforelabel = NULL;
	lastlabel = -1;

	if (cls != NULL && cls->StateList != NULL)
	{
		MakeStateList(cls->StateList, StateLabels);
	}
	else
	{
		StateLabels.Clear();
	}
}